

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void op_flat_append(c2m_ctx_t c2m_ctx,node_t_conflict n,node_t_conflict op)

{
  node_t_conflict pnVar1;
  node_t_conflict local_30;
  node_t_conflict el;
  node_t_conflict next_el;
  node_t_conflict op_local;
  node_t_conflict n_local;
  c2m_ctx_t c2m_ctx_local;
  
  if (op->code == N_LIST) {
    local_30 = DLIST_node_t_head(&(op->u).ops);
    while (local_30 != (node_t_conflict)0x0) {
      pnVar1 = DLIST_node_t_next(local_30);
      DLIST_node_t_remove(&(op->u).ops,local_30);
      op_append(c2m_ctx,n,local_30);
      local_30 = pnVar1;
    }
  }
  else {
    op_append(c2m_ctx,n,op);
  }
  return;
}

Assistant:

static void op_flat_append (c2m_ctx_t c2m_ctx, node_t n, node_t op) {
  if (op->code != N_LIST) {
    op_append (c2m_ctx, n, op);
    return;
  }
  for (node_t next_el, el = NL_HEAD (op->u.ops); el != NULL; el = next_el) {
    next_el = NL_NEXT (el);
    NL_REMOVE (op->u.ops, el);
    op_append (c2m_ctx, n, el);
  }
}